

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_pack.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  undefined1 local_20;
  undefined1 auStack_1f [2];
  undefined1 uStack_1d;
  undefined1 auStack_1c [4];
  TestStruct a;
  char **argv_local;
  int argc_local;
  
  a = (TestStruct)argv;
  poVar1 = std::operator<<((ostream *)&std::cout,"sizeof(struct TestStruct) = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"c1 ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,&local_20);
  poVar1 = std::operator<<(poVar1," s ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,auStack_1f);
  poVar1 = std::operator<<(poVar1," c2 ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,&uStack_1d);
  poVar1 = std::operator<<(poVar1," i ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,auStack_1c);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
	struct TestStruct a;

	cout << "sizeof(struct TestStruct) = " << sizeof(struct TestStruct) << endl;
	cout << "c1 " << static_cast<const void *>(&a.c1)
	     << " s " << static_cast<const void *>(&a.s)
	     << " c2 "<< static_cast<const void *>(&a.c2)
	     << " i " << static_cast<const void *>(&a.i)
	     << endl;

	return 0;
}